

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gme_File.cpp
# Opt level: O1

void Gme_File::copy_field_(char *out,char *in,int in_size)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  
  if ((in != (char *)0x0) && (*in != '\0')) {
    if (in_size != 0) {
      pcVar7 = in + (uint)in_size;
      do {
        if (0x1f < (int)*in - 1U) goto LAB_006b44c8;
        in = in + 1;
        in_size = in_size - 1;
      } while (in_size != 0);
      in_size = 0;
      in = pcVar7;
    }
LAB_006b44c8:
    uVar3 = 0xff;
    if (in_size < 0xff) {
      uVar3 = (ulong)(uint)in_size;
    }
    iVar2 = (int)uVar3;
    if (in_size < 1) {
      lVar4 = 0;
    }
    else {
      uVar5 = 0;
      do {
        if (in[uVar5] == '\0') {
          iVar2 = (int)uVar5;
          break;
        }
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
      lVar4 = (long)iVar2;
    }
    lVar4 = lVar4 + 1;
    do {
      if (lVar4 == 1) {
        lVar6 = 0;
        break;
      }
      lVar6 = lVar4 + -1;
      lVar1 = lVar4 + -2;
      lVar4 = lVar6;
    } while ((byte)in[lVar1] < 0x21);
    out[(int)lVar6] = '\0';
    memcpy(out,in,(long)(int)lVar6);
    iVar2 = strcmp(out,"?");
    if (((iVar2 == 0) || (iVar2 = strcmp(out,"<?>"), iVar2 == 0)) ||
       (iVar2 = strcmp(out,"< ? >"), iVar2 == 0)) {
      *out = '\0';
    }
  }
  return;
}

Assistant:

void Gme_File::copy_field_( char* out, const char* in, int in_size )
{
	if ( !in || !*in )
		return;
	
	// remove spaces/junk from beginning
	while ( in_size && unsigned (*in - 1) <= ' ' - 1 )
	{
		in++;
		in_size--;
	}
	
	// truncate
	if ( in_size > max_field_ )
		in_size = max_field_;
	
	// find terminator
	int len = 0;
	while ( len < in_size && in [len] )
		len++;
	
	// remove spaces/junk from end
	while ( len && unsigned (in [len - 1]) <= ' ' )
		len--;
	
	// copy
	out [len] = 0;
	memcpy( out, in, len );
	
	// strip out stupid fields that should have been left blank
	if ( !strcmp( out, "?" ) || !strcmp( out, "<?>" ) || !strcmp( out, "< ? >" ) )
		out [0] = 0;
}